

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decorator.hpp
# Opt level: O0

void __thiscall boost::unit_test::decorator::depends_on::~depends_on(depends_on *this)

{
  void *in_RDI;
  
  ~depends_on((depends_on *)0x248338);
  operator_delete(in_RDI,0x18);
  return;
}

Assistant:

class BOOST_TEST_DECL depends_on : public decorator::base {
public:
    explicit                depends_on( const_string dependency ) : m_dependency( dependency ) {}

private:
    // decorator::base interface
    virtual void            apply( test_unit& tu );
    virtual base_ptr        clone() const { return base_ptr(new depends_on( m_dependency )); }

    // Data members
    const_string            m_dependency;
}